

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O2

char ** acmod_set_attrib(acmod_set_t *acmod_set,acmod_id_t id)

{
  ci_acmod_t *pcVar1;
  
  if (id < acmod_set->n_ci) {
    pcVar1 = acmod_set->ci + id;
  }
  else {
    if (acmod_set->next_id <= id) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
              ,0x35d,"Phone id %u is out of range.\n");
      return (char **)0x0;
    }
    pcVar1 = (ci_acmod_t *)(acmod_set->multi + (id - acmod_set->n_ci));
  }
  if (pcVar1->attrib != (char **)0x0) {
    return pcVar1->attrib;
  }
  __assert_fail("attrib_list",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                ,0x362,"const char **acmod_set_attrib(acmod_set_t *, acmod_id_t)");
}

Assistant:

const char **
acmod_set_attrib(acmod_set_t *acmod_set,
		 acmod_id_t id)
{
    char **attrib_list;
    uint32 addr;

    if (id < acmod_set->n_ci) {
	attrib_list = acmod_set->ci[id].attrib;
    }
    else if (id < acmod_set->next_id) {
	addr = id - acmod_set->n_ci;

	attrib_list = acmod_set->multi[addr].attrib;
    }
    else {
	E_ERROR("Phone id %u is out of range.\n", id);

	return FALSE;
    }

    assert(attrib_list);
    
    return (const char **)attrib_list;
}